

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3TreeFinishNode(SegmentNode *pTree,int iHeight,sqlite3_int64 iLeftChild)

{
  int iVar1;
  int iVar2;
  int nStart;
  sqlite3_int64 iLeftChild_local;
  int iHeight_local;
  SegmentNode *pTree_local;
  
  iVar1 = sqlite3Fts3VarintLen(iLeftChild);
  iVar2 = -iVar1 + 10;
  pTree->aData[iVar2] = (char)iHeight;
  sqlite3Fts3PutVarint(pTree->aData + (-iVar1 + 0xb),iLeftChild);
  return iVar2;
}

Assistant:

static int fts3TreeFinishNode(
  SegmentNode *pTree, 
  int iHeight, 
  sqlite3_int64 iLeftChild
){
  int nStart;
  assert( iHeight>=1 && iHeight<128 );
  nStart = FTS3_VARINT_MAX - sqlite3Fts3VarintLen(iLeftChild);
  pTree->aData[nStart] = (char)iHeight;
  sqlite3Fts3PutVarint(&pTree->aData[nStart+1], iLeftChild);
  return nStart;
}